

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteObservations::IndividualToJointObservationIndices
          (MADPComponentDiscreteObservations *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jo_e,Scope *agSC)

{
  Index IVar1;
  Scope *sc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  MADPComponentDiscreteObservations *in_RDI;
  Index joI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31 [2];
  
  sc = (Scope *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  this_00 = local_31;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xad42ab);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)sc,(allocator_type *)in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xad42cb);
  GetNrObservations(in_RDI);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (this_00,sc,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  IVar1 = IndexTools::IndividualToJointIndices
                    (&sc->super_SDT,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  return IVar1;
}

Assistant:

Index MADPComponentDiscreteObservations::
IndividualToJointObservationIndices(
        const std::vector<Index>& jo_e, const Scope& agSC) const
{ 
    vector<size_t> nr_A_e(agSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        GetNrObservations(), agSC, nr_A_e);
    Index joI = IndexTools::IndividualToJointIndices( jo_e, nr_A_e);
    return(joI);
}